

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void __thiscall
wallet::CWallet::DeactivateScriptPubKeyMan(CWallet *this,uint256 id,OutputType type,bool internal)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  WalletDatabase *pWVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_1;
  bool bVar4;
  _Base_ptr p_Var5;
  string *psVar6;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  _Base_ptr p_Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined7 in_register_00000011;
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  *this_01;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>,_std::_Rb_tree_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  pVar12;
  undefined8 in_stack_ffffffffffffff28;
  _Head_base<0UL,_wallet::DatabaseBatch_*,_false> in_stack_ffffffffffffff30;
  WalletDatabase *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  OutputType OVar13;
  _Alloc_hider in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff50 [24];
  long *local_98 [2];
  long local_88 [2];
  string local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = &this->m_external_spk_managers;
  if ((int)CONCAT71(in_register_00000011,internal) != 0) {
    this_01 = &this->m_internal_spk_managers;
  }
  p_Var8 = (this_01->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var8 != (_Base_ptr)0x0) {
    p_Var1 = &(this_01->_M_t)._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      if ((int)type <= (int)p_Var8[1]._M_color) {
        p_Var5 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[(int)p_Var8[1]._M_color < (int)type];
    } while (p_Var8 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var5 != p_Var1) && ((int)p_Var5[1]._M_color <= (int)type)) &&
       (p_Var5[1]._M_parent != (_Base_ptr)0x0)) {
      OVar13 = type;
      (**(code **)(*(long *)p_Var5[1]._M_parent + 0xd0))(&local_58);
      auVar11[0] = -((string)id.super_base_blob<256U>.m_data._M_elems[0] == local_58._0_1_);
      auVar11[1] = -(id.super_base_blob<256U>.m_data._M_elems[1] == local_58._1_1_);
      auVar11[2] = -(id.super_base_blob<256U>.m_data._M_elems[2] == local_58._2_1_);
      auVar11[3] = -(id.super_base_blob<256U>.m_data._M_elems[3] == local_58._3_1_);
      auVar11[4] = -(id.super_base_blob<256U>.m_data._M_elems[4] == local_58._4_1_);
      auVar11[5] = -(id.super_base_blob<256U>.m_data._M_elems[5] == local_58._5_1_);
      auVar11[6] = -(id.super_base_blob<256U>.m_data._M_elems[6] == local_58._6_1_);
      auVar11[7] = -(id.super_base_blob<256U>.m_data._M_elems[7] == local_58._7_1_);
      auVar11[8] = -(id.super_base_blob<256U>.m_data._M_elems[8] == (uchar)uStack_50);
      auVar11[9] = -(id.super_base_blob<256U>.m_data._M_elems[9] == uStack_50._1_1_);
      auVar11[10] = -(id.super_base_blob<256U>.m_data._M_elems[10] == uStack_50._2_1_);
      auVar11[0xb] = -(id.super_base_blob<256U>.m_data._M_elems[0xb] == uStack_50._3_1_);
      auVar11[0xc] = -(id.super_base_blob<256U>.m_data._M_elems[0xc] == uStack_50._4_1_);
      auVar11[0xd] = -(id.super_base_blob<256U>.m_data._M_elems[0xd] == uStack_50._5_1_);
      auVar11[0xe] = -(id.super_base_blob<256U>.m_data._M_elems[0xe] == uStack_50._6_1_);
      auVar11[0xf] = -(id.super_base_blob<256U>.m_data._M_elems[0xf] == uStack_50._7_1_);
      auVar10[0] = -(id.super_base_blob<256U>.m_data._M_elems[0x10] == (uchar)local_48);
      auVar10[1] = -(id.super_base_blob<256U>.m_data._M_elems[0x11] == local_48._1_1_);
      auVar10[2] = -(id.super_base_blob<256U>.m_data._M_elems[0x12] == local_48._2_1_);
      auVar10[3] = -(id.super_base_blob<256U>.m_data._M_elems[0x13] == local_48._3_1_);
      auVar10[4] = -(id.super_base_blob<256U>.m_data._M_elems[0x14] == local_48._4_1_);
      auVar10[5] = -(id.super_base_blob<256U>.m_data._M_elems[0x15] == local_48._5_1_);
      auVar10[6] = -(id.super_base_blob<256U>.m_data._M_elems[0x16] == local_48._6_1_);
      auVar10[7] = -(id.super_base_blob<256U>.m_data._M_elems[0x17] == local_48._7_1_);
      auVar10[8] = -(id.super_base_blob<256U>.m_data._M_elems[0x18] == (uchar)uStack_40);
      auVar10[9] = -(id.super_base_blob<256U>.m_data._M_elems[0x19] == uStack_40._1_1_);
      auVar10[10] = -(id.super_base_blob<256U>.m_data._M_elems[0x1a] == uStack_40._2_1_);
      auVar10[0xb] = -(id.super_base_blob<256U>.m_data._M_elems[0x1b] == uStack_40._3_1_);
      auVar10[0xc] = -(id.super_base_blob<256U>.m_data._M_elems[0x1c] == uStack_40._4_1_);
      auVar10[0xd] = -(id.super_base_blob<256U>.m_data._M_elems[0x1d] == uStack_40._5_1_);
      auVar10[0xe] = -(id.super_base_blob<256U>.m_data._M_elems[0x1e] == uStack_40._6_1_);
      auVar10[0xf] = -(id.super_base_blob<256U>.m_data._M_elems[0x1f] == uStack_40._7_1_);
      auVar10 = auVar10 & auVar11;
      if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff) {
        base_blob<256u>::ToString_abi_cxx11_(&local_78,&id);
        psVar6 = FormatOutputType_abi_cxx11_(type);
        pcVar2 = (psVar6->_M_dataplus)._M_p;
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_98,pcVar2,pcVar2 + psVar6->_M_string_length);
        parameters._M_string_length = (size_type)in_stack_ffffffffffffff30._M_head_impl;
        parameters._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff28;
        parameters.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffff38;
        parameters.field_2._8_4_ = in_stack_ffffffffffffff40;
        parameters.field_2._12_4_ = OVar13;
        parameters_1._M_string_length = in_stack_ffffffffffffff50._0_8_;
        parameters_1.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )in_stack_ffffffffffffff50._8_16_;
        parameters_1._M_dataplus._M_p = in_stack_ffffffffffffff48._M_p;
        WalletLogPrintf<std::__cxx11::string,std::__cxx11::string,char_const*>
                  (this,"Deactivate spkMan: id = %s, type = %s, internal = %s\n",parameters,
                   parameters_1,(char *)&local_78);
        if (local_98[0] != local_88) {
          operator_delete(local_98[0],local_88[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        pWVar3 = (this->m_database)._M_t.
                 super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                 .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
        if (pWVar3 == (WalletDatabase *)0x0) {
          __assert_fail("static_cast<bool>(m_database)",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                        ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
        }
        (*pWVar3->_vptr_WalletDatabase[0xe])((WalletBatch *)&stack0xffffffffffffff30,pWVar3,1);
        bVar4 = WalletBatch::EraseActiveScriptPubKeyMan
                          ((WalletBatch *)&stack0xffffffffffffff30,(uint8_t)type,internal);
        if (!bVar4) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xffffffffffffff48,"DeactivateScriptPubKeyMan","");
          pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &stack0xffffffffffffff48,": erasing active ScriptPubKeyMan id failed");
          local_58 = (pbVar7->_M_dataplus)._M_p;
          paVar9 = &pbVar7->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58 == paVar9) {
            local_48 = paVar9->_M_allocated_capacity;
            uStack_40 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
            local_58 = (pointer)&local_48;
          }
          else {
            local_48 = paVar9->_M_allocated_capacity;
          }
          uStack_50 = pbVar7->_M_string_length;
          (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar7->_M_string_length = 0;
          (pbVar7->field_2)._M_local_buf[0] = '\0';
          std::runtime_error::runtime_error(this_00,(string *)&local_58);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00c38d56;
        }
        pVar12 = std::
                 _Rb_tree<OutputType,_std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>,_std::_Select1st<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
                 ::equal_range(&this_01->_M_t,(key_type *)&stack0xffffffffffffff44);
        std::
        _Rb_tree<OutputType,_std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>,_std::_Select1st<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
        ::_M_erase_aux(&this_01->_M_t,(_Base_ptr)pVar12.first._M_node,
                       (_Base_ptr)pVar12.second._M_node);
        if ((__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)
            in_stack_ffffffffffffff30._M_head_impl !=
            (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0
           ) {
          (*(in_stack_ffffffffffffff30._M_head_impl)->_vptr_DatabaseBatch[5])();
        }
      }
    }
  }
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::operator()(&this->NotifyCanGetAddressesChanged);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00c38d56:
  __stack_chk_fail();
}

Assistant:

void CWallet::DeactivateScriptPubKeyMan(uint256 id, OutputType type, bool internal)
{
    auto spk_man = GetScriptPubKeyMan(type, internal);
    if (spk_man != nullptr && spk_man->GetID() == id) {
        WalletLogPrintf("Deactivate spkMan: id = %s, type = %s, internal = %s\n", id.ToString(), FormatOutputType(type), internal ? "true" : "false");
        WalletBatch batch(GetDatabase());
        if (!batch.EraseActiveScriptPubKeyMan(static_cast<uint8_t>(type), internal)) {
            throw std::runtime_error(std::string(__func__) + ": erasing active ScriptPubKeyMan id failed");
        }

        auto& spk_mans = internal ? m_internal_spk_managers : m_external_spk_managers;
        spk_mans.erase(type);
    }

    NotifyCanGetAddressesChanged();
}